

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O0

TSourceLoc * __thiscall glslang::TInputScanner::getSourceLoc(TInputScanner *this)

{
  TSourceLoc *pTVar1;
  int *piVar2;
  int local_20 [2];
  TInputScanner *local_18;
  TInputScanner *this_local;
  
  if ((this->singleLogical & 1U) == 0) {
    pTVar1 = this->loc;
    local_20[1] = 0;
    local_20[0] = (this->numSources - this->finale) + -1;
    local_18 = this;
    piVar2 = std::min<int>(&this->currentSource,local_20);
    piVar2 = std::max<int>(local_20 + 1,piVar2);
    this_local = (TInputScanner *)(pTVar1 + *piVar2);
  }
  else {
    this_local = (TInputScanner *)&this->logicalSourceLoc;
  }
  return (TSourceLoc *)this_local;
}

Assistant:

const TSourceLoc& getSourceLoc() const
    {
        if (singleLogical) {
            return logicalSourceLoc;
        } else {
            return loc[std::max(0, std::min(currentSource, numSources - finale - 1))];
        }
    }